

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O2

bool __thiscall trimesh::dataset_t::compare_cells<2>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  shared_ptr<tri_cc_t> *this_00;
  int c;
  bool bVar1;
  bool bVar2;
  cellid_t c_00;
  cellid_t c_01;
  cellid_t *pcVar3;
  type ptVar4;
  cellid_t f2;
  cellid_t f1;
  int local_30;
  int local_2c;
  
  pcVar3 = max_fct(this,*c1);
  c = *pcVar3;
  local_2c = c;
  pcVar3 = max_fct(this,*c2);
  local_30 = *pcVar3;
  if (c == local_30) {
    this_00 = &this->m_tcc;
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(this_00);
    c_00 = tri_cc_t::get_opp_cell(ptVar4,c,*c1);
    local_2c = c_00;
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(this_00);
    c_01 = tri_cc_t::get_opp_cell(ptVar4,c,*c2);
    local_30 = c_01;
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(this_00);
    bVar1 = tri_cc_t::is_cell_boundry(ptVar4,c_00);
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(this_00);
    bVar2 = tri_cc_t::is_cell_boundry(ptVar4,c_01);
    if (bVar1 == bVar2) {
      bVar1 = compare_cells<0>(this,&local_2c,&local_30);
    }
  }
  else {
    bVar1 = compare_cells<1>(this,&local_2c,&local_30);
  }
  return bVar1;
}

Assistant:

inline bool dataset_t::compare_cells(const cellid_t & c1, const cellid_t &c2) const
  {
    cellid_t f1 = max_fct(c1);
    cellid_t f2 = max_fct(c2);

    if(f1 != f2)
      return compare_cells<dim-1>(f1,f2);

    f1 = m_tcc->get_opp_cell(f1,c1);
    f2 = m_tcc->get_opp_cell(f2,c2);

    bool is_bnd_f1 = m_tcc->is_cell_boundry(f1);
    bool is_bnd_f2 = m_tcc->is_cell_boundry(f2);

    if(is_bnd_f1 != is_bnd_f2)
      return (is_bnd_f1);

    return compare_cells<0>(f1,f2);
  }